

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::SimpleNode::AnnotatePass3
          (SimpleNode *this,Compiler *compiler,CountDomain accumConsumes,
          CharSet<char16_t> *accumFollow,bool accumFollowIrrefutable,bool accumFollowEOL)

{
  bool bVar1;
  byte local_2b;
  bool accumFollowEOL_local;
  bool accumFollowIrrefutable_local;
  CharSet<char16_t> *accumFollow_local;
  Compiler *compiler_local;
  SimpleNode *this_local;
  CountDomain accumConsumes_local;
  
  (this->super_Node).followConsumes = accumConsumes;
  (this->super_Node).followSet = accumFollow;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffffb | (uint)accumFollowIrrefutable << 2;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffeff | (uint)accumFollowEOL << 8;
  local_2b = 0;
  if ((this->super_Node).tag == BOL) {
    bVar1 = CountDomain::IsExact(&(this->super_Node).prevConsumes,0);
    local_2b = 0;
    if ((((bVar1) && (local_2b = 0, (compiler->program->flags & MultilineRegexFlag) == NoRegexFlags)
         ) && (local_2b = 0, (*(uint *)&(this->super_Node).field_0xc >> 0xb & 1) != 0)) &&
       (local_2b = 0, (*(uint *)&(this->super_Node).field_0xc >> 0xd & 1) != 0)) {
      local_2b = (byte)(*(uint *)&(this->super_Node).field_0xc >> 7) & 1;
    }
  }
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffbfff | (uint)local_2b << 0xe;
  return;
}

Assistant:

void SimpleNode::AnnotatePass3(Compiler& compiler, CountDomain accumConsumes, CharSet<Char>* accumFollow, bool accumFollowIrrefutable, bool accumFollowEOL)
    {
        followConsumes = accumConsumes;
        followSet = accumFollow;
        isFollowIrrefutable = accumFollowIrrefutable;
        isFollowEOL = accumFollowEOL;

        hasInitialHardFailBOI = ((tag == BOL) &&
            prevConsumes.IsExact(0) &&
            (compiler.program->flags & MultilineRegexFlag) == 0 &&
            isAtLeastOnce &&
            isNotNegated &&
            isPrevWillNotRegress);
    }